

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O0

void __thiscall QTimer::start(QTimer *this,milliseconds interval)

{
  parameter_type pVar1;
  QTimerPrivate *this_00;
  rep rVar2;
  char *in_RDI;
  long in_FS_OFFSET;
  bool intervalChanged;
  int msec;
  QTimerPrivate *d;
  QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
  *in_stack_00000030;
  int t;
  duration<long,_std::ratio<1L,_1000L>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTimer *)0x42b0ef);
  local_10.__r = (rep)checkInterval(in_RDI,(milliseconds)this);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_10);
  t = (int)rVar2;
  pVar1 = ::QObjectCompatProperty::operator_cast_to_int
                    ((QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
                      *)0x42b142);
  QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
  ::setValue((QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
              *)this_00,t);
  start((QTimer *)this_00);
  if ((int)rVar2 != pVar1) {
    QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
    ::notify(in_stack_00000030);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTimer::start(std::chrono::milliseconds interval)
{
    Q_D(QTimer);

    interval = checkInterval("QTimer::start", interval);
    const int msec = interval.count();
    const bool intervalChanged = msec != d->inter;
    d->inter.setValue(msec);
    start();
    if (intervalChanged)
        d->inter.notify();
}